

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O0

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::isPreguardContaminated
          (StateQueryMemoryWriteGuard<unsigned_char[4]> *this)

{
  ulong local_20;
  size_t i;
  StateQueryMemoryWriteGuard<unsigned_char[4]> *this_local;
  
  local_20 = 0;
  while( true ) {
    if (3 < local_20) {
      return false;
    }
    if (this->m_preguard[local_20] != 0xde) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::isPreguardContaminated (void) const
{
	for (size_t i = 0; i < sizeof(T); ++i)
		if (((deUint8*)&m_preguard)[i] != (deUint8)WRITE_GUARD_VALUE)
			return true;
	return false;
}